

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BailOutInstrTemplate<IR::Instr> *
IR::BailOutInstrTemplate<IR::Instr>::New
          (OpCode opcode,BailOutKind kind,Instr *bailOutTarget,Func *func)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  uint32 bailOutOffset;
  undefined4 *puVar3;
  JitArenaAllocator *alloc;
  BailOutInfo *this_00;
  BailOutInstrTemplate<IR::Instr> *pBVar4;
  TrackAllocData local_50;
  BailOutInfo *local_28;
  BailOutInfo *bailOutInfo;
  Func *func_local;
  Instr *bailOutTarget_local;
  BailOutKind kind_local;
  OpCode opcode_local;
  
  bailOutInfo = (BailOutInfo *)func;
  func_local = (Func *)bailOutTarget;
  bailOutTarget_local._0_4_ = kind;
  bailOutTarget_local._6_2_ = opcode;
  if (func != bailOutTarget->m_func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x596,"(func == bailOutTarget->m_func)","func == bailOutTarget->m_func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)bailOutInfo;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BailOutInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x597);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this,&local_50);
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,alloc,0x4e98c0);
  bailOutOffset = Instr::GetByteCodeOffset((Instr *)func_local);
  BailOutInfo::BailOutInfo(this_00,bailOutOffset,(Func *)bailOutInfo);
  this_00->bailOutOpcode = bailOutTarget_local._6_2_;
  local_28 = this_00;
  pBVar4 = New(bailOutTarget_local._6_2_,(BailOutKind)bailOutTarget_local,this_00,
               (Func *)bailOutInfo);
  return pBVar4;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, BailOutKind kind, IR::Instr * bailOutTarget, Func * func)
{
    Assert(func == bailOutTarget->m_func);
    BailOutInfo * bailOutInfo = JitAnew(func->m_alloc, BailOutInfo, bailOutTarget->GetByteCodeOffset(), func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = opcode;
#endif
    return BailOutInstrTemplate::New(opcode, kind, bailOutInfo, func);
}